

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heartbleed.c
# Opt level: O0

int main(void)

{
  int iVar1;
  size_t sVar2;
  uchar auStack_38 [4];
  int len_1;
  uchar test_case_1 [21];
  uchar uStack_d;
  int len;
  uchar test_case [5];
  
  _uStack_d = 0xfd0101;
  len._3_1_ = 0;
  sVar2 = strlen((char *)&uStack_d);
  iVar1 = (int)sVar2;
  printf("\nRequest : ");
  print_buffer(&uStack_d,iVar1);
  test_openssl_1_0_1f(&uStack_d,iVar1);
  test_openssl_1_0_1g(&uStack_d,iVar1);
  _auStack_38 = 0xdeefbeaddefd0101;
  test_case_1[0] = 0xad;
  test_case_1[1] = 0xbe;
  test_case_1[2] = 0xef;
  test_case_1[3] = 0xde;
  test_case_1[4] = 0xad;
  test_case_1[5] = 0xbe;
  test_case_1[6] = 0xef;
  test_case_1[7] = 0xde;
  test_case_1[8] = 0xad;
  test_case_1[9] = 0xbe;
  test_case_1[10] = 0xef;
  test_case_1[0xb] = '\0';
  test_case_1[0xc] = '\0';
  sVar2 = strlen((char *)auStack_38);
  iVar1 = (int)sVar2;
  printf("\nRequest : ");
  print_buffer(auStack_38,iVar1);
  test_openssl_1_0_1f(auStack_38,iVar1);
  test_openssl_1_0_1g(auStack_38,iVar1);
  return 0;
}

Assistant:

int main() {

  // 0x01fd -> 509

  {
    unsigned char test_case[] = "\x01\x01\xfd\x00";
    int len = (int) strlen(test_case);

    printf("\nRequest : ");
    print_buffer(test_case, len);

    test_openssl_1_0_1f(test_case, len);
    test_openssl_1_0_1g(test_case, len);
  }

  {
    unsigned char test_case[] = "\x01\x01\xfd\xde\xad\xbe\xef\xde\xad\xbe\xef\xde\xad\xbe\xef\xde\xad\xbe\xef\x00";
    int len = (int) strlen(test_case);

    printf("\nRequest : ");
    print_buffer(test_case, len);

    test_openssl_1_0_1f(test_case, len);
    test_openssl_1_0_1g(test_case, len);
  }
}